

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::SnapshotEventLogEntry_UnloadSnapshot(EventLogEntry *evt)

{
  SnapshotEventLogEntry *pSVar1;
  
  pSVar1 = GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                     (evt);
  if (pSVar1->Snap != (SnapShot *)0x0) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::SnapShot>
              (&Memory::HeapAllocator::Instance,pSVar1->Snap);
    pSVar1->Snap = (SnapShot *)0x0;
  }
  return;
}

Assistant:

void SnapshotEventLogEntry_UnloadSnapshot(EventLogEntry* evt)
        {
            SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            if(snapEvt->Snap != nullptr)
            {
                TT_HEAP_DELETE(SnapShot, snapEvt->Snap);
                snapEvt->Snap = nullptr;
            }
        }